

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O0

bool __thiscall CSemaphore::try_wait(CSemaphore *this)

{
  long lVar1;
  bool bVar2;
  long in_RDI;
  long in_FS_OFFSET;
  lock_guard<std::mutex> lock;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
             ,(mutex_type *)0x250b33);
  bVar2 = 0 < *(int *)(in_RDI + 0x58);
  if (bVar2) {
    *(int *)(in_RDI + 0x58) = *(int *)(in_RDI + 0x58) + -1;
  }
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
            );
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool try_wait() noexcept
    {
        std::lock_guard<std::mutex> lock(mutex);
        if (value < 1) {
            return false;
        }
        value--;
        return true;
    }